

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng::save_file(vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,
                       string *filename)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  char *pcVar4;
  const_reference local_248;
  long local_220;
  ofstream file;
  string *filename_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer_local;
  
  pcVar4 = (char *)std::__cxx11::string::c_str();
  _Var3 = std::operator|(_S_out,_S_bin);
  std::ofstream::ofstream(&local_220,pcVar4,_Var3);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) == 0) {
    bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(buffer);
    if (bVar2) {
      local_248 = (const_reference)0x0;
    }
    else {
      local_248 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](buffer,0);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(buffer);
    std::ostream::write((char *)&local_220,(long)local_248);
    buffer_local._4_4_ = 0;
  }
  else {
    buffer_local._4_4_ = 0x4f;
  }
  std::ofstream::~ofstream(&local_220);
  return buffer_local._4_4_;
}

Assistant:

unsigned save_file(const std::vector<unsigned char>& buffer, const std::string& filename)
{
  std::ofstream file(filename.c_str(), std::ios::out|std::ios::binary);
  if(!file) return 79;
  file.write(buffer.empty() ? 0 : (char*)&buffer[0], std::streamsize(buffer.size()));
  return 0;
}